

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

status_t tchecker::refdbm::constrain
                   (db_t *rdbm,reference_clock_variables_t *r,clock_constraint_container_t *cc)

{
  clock_constraint_t *pcVar1;
  clock_constraint_t *pcVar2;
  status_t sVar3;
  clock_constraint_t *c_00;
  clock_constraint_t *c;
  
  pcVar1 = (cc->
           super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pcVar2 = (cc->
           super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    c_00 = pcVar2;
    if (c_00 == pcVar1) break;
    sVar3 = constrain(rdbm,r,c_00);
    pcVar2 = c_00 + 1;
  } while (sVar3 != EMPTY);
  return (status_t)(c_00 == pcVar1);
}

Assistant:

enum tchecker::dbm::status_t constrain(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                       tchecker::clock_constraint_container_t const & cc)
{
  for (tchecker::clock_constraint_t const & c : cc) {
    enum tchecker::dbm::status_t status = tchecker::refdbm::constrain(rdbm, r, c);
    if (status == tchecker::dbm::EMPTY)
      return status;
  }
  return tchecker::dbm::NON_EMPTY;
}